

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

size_t mpack_node_copy_utf8(mpack_node_t node,char *buffer,size_t bufsize)

{
  char *pcVar1;
  mpack_node_data_t *pmVar2;
  mpack_error_t error;
  _Bool _Var3;
  mpack_tree_t *tree;
  mpack_node_data_t *pmVar4;
  ulong bytes;
  
  tree = node.tree;
  pmVar4 = node.data;
  if (tree->error != mpack_ok) {
    return 0;
  }
  if (pmVar4->type == mpack_type_str) {
    bytes = (ulong)pmVar4->len;
    if (bufsize < bytes) {
      error = mpack_error_too_big;
      goto LAB_00107e2b;
    }
    pcVar1 = tree->data;
    pmVar2 = (pmVar4->value).children;
    _Var3 = mpack_utf8_check(pcVar1 + (long)pmVar2,bytes);
    if (_Var3) {
      memcpy(buffer,pcVar1 + (long)pmVar2,bytes);
      return (ulong)pmVar4->len;
    }
  }
  error = mpack_error_type;
LAB_00107e2b:
  mpack_tree_flag_error(tree,error);
  return 0;
}

Assistant:

size_t mpack_node_copy_utf8(mpack_node_t node, char* buffer, size_t bufsize) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    mpack_assert(bufsize == 0 || buffer != NULL, "buffer is NULL for maximum of %i bytes", (int)bufsize);

    mpack_type_t type = node.data->type;
    if (type != mpack_type_str) {
        mpack_node_flag_error(node, mpack_error_type);
        return 0;
    }

    if (node.data->len > bufsize) {
        mpack_node_flag_error(node, mpack_error_too_big);
        return 0;
    }

    if (!mpack_utf8_check(mpack_node_data_unchecked(node), node.data->len)) {
        mpack_node_flag_error(node, mpack_error_type);
        return 0;
    }

    mpack_memcpy(buffer, mpack_node_data_unchecked(node), node.data->len);
    return (size_t)node.data->len;
}